

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O0

void __thiscall
TPZMatrixSolver<float>::TPZMatrixSolver
          (TPZMatrixSolver<float> *this,void **vtt,TPZAutoPointer<TPZMatrix<float>_> *Refmat)

{
  TPZAutoPointer<TPZMatrix<float>_> *in_RDX;
  TPZAutoPointer<TPZMatrix<float>_> *in_RSI;
  undefined8 *in_RDI;
  TPZAutoPointer<TPZMatrix<float>_> *copy;
  TPZFMatrix<float> *in_stack_ffffffffffffffe0;
  
  TPZSolver::TPZSolver((TPZSolver *)in_RSI,&in_RDX->fRef);
  *in_RDI = in_RSI->fRef;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(in_RSI);
  copy = (TPZAutoPointer<TPZMatrix<float>_> *)(in_RDI + 2);
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffffe0);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(in_RSI);
  TPZAutoPointer<TPZMatrix<float>_>::operator=(in_RDX,copy);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(TPZAutoPointer<TPZMatrix<TVar> > Refmat) :
fScratch()
{
	fContainer = Refmat;
}